

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_nullAssignmentEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_nullAssignmentEmptyForEmpty_Test
          (optTyped_nullAssignmentEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  optTyped_nullAssignmentEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
  *this_local;
  
  ~optTyped_nullAssignmentEmptyForEmpty_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, nullAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o;
  o = nullopt;
  EXPECT_FALSE(o);
  EXPECT_FALSE(o.has_value());
  EXPECT_THROW(o.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o.value_or(this->value_2));
}